

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::
ModuleLevelDescriptorName<google::protobuf::Descriptor>
          (string *__return_storage_ptr__,Generator *this,Descriptor *descriptor)

{
  FileDescriptor *pFVar1;
  AlphaNum *in_R8;
  string_view filename;
  string_view separator;
  AlphaNum local_1a8;
  AlphaNum local_178;
  string_view local_148;
  string local_138;
  AlphaNum local_118;
  string local_e8;
  AlphaNum local_c8;
  AlphaNum local_98;
  string local_68;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined1 local_21;
  Descriptor *local_20;
  Descriptor *descriptor_local;
  Generator *this_local;
  string *name;
  
  local_21 = 0;
  local_20 = descriptor;
  descriptor_local = (Descriptor *)this;
  this_local = (Generator *)__return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"_");
  separator._M_str = (char *)in_R8;
  separator._M_len = (size_t)local_38._M_str;
  NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (__return_storage_ptr__,(python *)descriptor,(Descriptor *)local_38._M_len,separator);
  absl::lts_20250127::AsciiStrToUpper(__return_storage_ptr__);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_98,"_");
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_c8,__return_storage_ptr__);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_68,(lts_20250127 *)&local_98,&local_c8,(AlphaNum *)local_38._M_str);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pFVar1 = Descriptor::file(local_20);
  if (pFVar1 != this->file_) {
    pFVar1 = Descriptor::file(local_20);
    local_148 = FileDescriptor::name(pFVar1);
    filename._M_str = (char *)this;
    filename._M_len = (size_t)local_148._M_str;
    python::(anonymous_namespace)::ModuleAlias_abi_cxx11_
              (&local_138,(_anonymous_namespace_ *)local_148._M_len,filename);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_118,&local_138);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_178,".");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_1a8,__return_storage_ptr__);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_e8,(lts_20250127 *)&local_118,&local_178,&local_1a8,in_R8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::ModuleLevelDescriptorName(
    const DescriptorT& descriptor) const {
  // FIXME(robinson):
  // We currently don't worry about collisions with underscores in the type
  // names, so these would collide in nasty ways if found in the same file:
  //   OuterProto.ProtoA.ProtoB
  //   OuterProto_ProtoA.ProtoB  # Underscore instead of period.
  // As would these:
  //   OuterProto.ProtoA_.ProtoB
  //   OuterProto.ProtoA._ProtoB  # Leading vs. trailing underscore.
  // (Contrived, but certainly possible).
  //
  // The C++ implementation doesn't guard against this either.  Leaving
  // it for now...
  std::string name = NamePrefixedWithNestedTypes(descriptor, "_");
  absl::AsciiStrToUpper(&name);
  // Module-private for now.  Easy to make public later; almost impossible
  // to make private later.
  name = absl::StrCat("_", name);
  // We now have the name relative to its own module.  Also qualify with
  // the module name iff this descriptor is from a different .proto file.
  if (descriptor.file() != file_) {
    name = absl::StrCat(ModuleAlias(descriptor.file()->name()), ".", name);
  }
  return name;
}